

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O1

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter>::
visitDefault<slang::syntax::SyntaxListBase&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::InterleavedRewriter> *this,SyntaxListBase *node)

{
  SyntaxNode *node_00;
  uint uVar1;
  size_t index;
  
  if (node->childCount != 0) {
    uVar1 = 1;
    index = 0;
    do {
      node_00 = SyntaxNode::childNode(&node->super_SyntaxNode,index);
      if (node_00 == (SyntaxNode *)0x0) {
        SyntaxNode::childToken(&node->super_SyntaxNode,index);
      }
      else {
        detail::
        visitSyntaxNode<slang::syntax::SyntaxNode,CATCH2_INTERNAL_TEST_8()::InterleavedRewriter>
                  (node_00,(InterleavedRewriter *)this);
      }
      index = (size_t)uVar1;
      uVar1 = uVar1 + 1;
    } while (index < node->childCount);
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }